

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dbformat.cc
# Opt level: O0

void __thiscall leveldb::LookupKey::LookupKey(LookupKey *this,Slice *user_key,SequenceNumber s)

{
  size_t __n;
  char *__dest;
  char *__src;
  uint64_t value;
  char *local_38;
  char *dst;
  size_t needed;
  size_t usize;
  SequenceNumber s_local;
  Slice *user_key_local;
  LookupKey *this_local;
  
  __n = Slice::size(user_key);
  if (__n + 0xd < 0xc9) {
    local_38 = this->space_;
  }
  else {
    local_38 = (char *)operator_new__(__n + 0xd);
  }
  this->start_ = local_38;
  __dest = EncodeVarint32(local_38,(int)__n + 8);
  this->kstart_ = __dest;
  __src = Slice::data(user_key);
  memcpy(__dest,__src,__n);
  value = PackSequenceAndType(s,kTypeValue);
  EncodeFixed64(__dest + __n,value);
  this->end_ = __dest + __n + 8;
  return;
}

Assistant:

LookupKey::LookupKey(const Slice& user_key, SequenceNumber s) {
  size_t usize = user_key.size();
  size_t needed = usize + 13;  // A conservative estimate
  char* dst;
  if (needed <= sizeof(space_)) {
    dst = space_;
  } else {
    dst = new char[needed];
  }
  start_ = dst;
  dst = EncodeVarint32(dst, usize + 8);
  kstart_ = dst;
  memcpy(dst, user_key.data(), usize);
  dst += usize;
  EncodeFixed64(dst, PackSequenceAndType(s, kValueTypeForSeek));
  dst += 8;
  end_ = dst;
}